

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

void set32(UNewTrie2 *trie,UChar32 c,UBool forLSCP,uint32_t value,UErrorCode *pErrorCode)

{
  int32_t iVar1;
  int32_t block;
  UErrorCode *pErrorCode_local;
  uint32_t value_local;
  UBool forLSCP_local;
  UChar32 c_local;
  UNewTrie2 *trie_local;
  
  if ((trie == (UNewTrie2 *)0x0) || (trie->isCompacted != '\0')) {
    *pErrorCode = U_NO_WRITE_PERMISSION;
  }
  else {
    iVar1 = getDataBlock(trie,c,forLSCP);
    if (iVar1 < 0) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      trie->data[(int)(iVar1 + (c & 0x1fU))] = value;
    }
  }
  return;
}

Assistant:

static void
set32(UNewTrie2 *trie,
      UChar32 c, UBool forLSCP, uint32_t value,
      UErrorCode *pErrorCode) {
    int32_t block;

    if(trie==NULL || trie->isCompacted) {
        *pErrorCode=U_NO_WRITE_PERMISSION;
        return;
    }
#ifdef UCPTRIE_DEBUG
    umutablecptrie_set(trie->t3, c, value, pErrorCode);
#endif

    block=getDataBlock(trie, c, forLSCP);
    if(block<0) {
        *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    trie->data[block+(c&UTRIE2_DATA_MASK)]=value;
}